

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O0

PropertiesIterator * __thiscall
Rml::ElementStyle::Iterate(PropertiesIterator *__return_storage_ptr__,ElementStyle *this)

{
  PropertyIt it_definition_00;
  PropertyIt it_definition_end_00;
  bool bVar1;
  PropertyMap *pPVar2;
  element_type *this_00;
  PropertyDictionary *this_01;
  const_iterator it_style;
  const_iterator it_style_end_00;
  const_iterator cVar3;
  PropertyMap *local_80;
  NodePtr local_78;
  NodePtr local_70;
  NodePtr local_68;
  PropertyMap *definition_properties;
  const_iterator it_definition_end;
  const_iterator it_definition;
  const_iterator it_style_end;
  const_iterator it_style_begin;
  PropertyMap *property_map;
  ElementStyle *this_local;
  
  pPVar2 = PropertyDictionary::GetProperties(&this->inline_properties);
  it_style = robin_hood::detail::
             Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
             ::begin(pPVar2);
  it_style_end_00 =
       robin_hood::detail::
       Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
       ::end(pPVar2);
  memset(&it_definition_end.mInfo,0,0x10);
  robin_hood::detail::
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  ::Iter<true>::Iter((Iter<true> *)&it_definition_end.mInfo);
  memset(&definition_properties,0,0x10);
  robin_hood::detail::
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  ::Iter<true>::Iter((Iter<true> *)&definition_properties);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->definition);
  if (bVar1) {
    this_00 = ::std::
              __shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->definition);
    this_01 = ElementDefinition::GetProperties(this_00);
    pPVar2 = PropertyDictionary::GetProperties(this_01);
    cVar3 = robin_hood::detail::
            Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            ::begin(pPVar2);
    local_70 = cVar3.mKeyVals;
    it_definition_end.mInfo = (uint8_t *)local_70;
    local_68 = (NodePtr)cVar3.mInfo;
    it_definition.mKeyVals = local_68;
    cVar3 = robin_hood::detail::
            Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            ::end(pPVar2);
    local_80 = (PropertyMap *)cVar3.mKeyVals;
    definition_properties = local_80;
    local_78 = (NodePtr)cVar3.mInfo;
    it_definition_end.mKeyVals = local_78;
  }
  it_definition_00.mInfo = (uint8_t *)it_definition.mKeyVals;
  it_definition_00.mKeyVals = (NodePtr)it_definition_end.mInfo;
  it_definition_end_00.mInfo = (uint8_t *)it_definition_end.mKeyVals;
  it_definition_end_00.mKeyVals = (NodePtr)definition_properties;
  PropertiesIterator::PropertiesIterator
            (__return_storage_ptr__,it_style,it_style_end_00,it_definition_00,it_definition_end_00);
  return __return_storage_ptr__;
}

Assistant:

PropertiesIterator ElementStyle::Iterate() const
{
	// Note: Value initialized iterators are only guaranteed to compare equal in C++14, and only for iterators
	// satisfying the ForwardIterator requirements.
#ifdef _MSC_VER
	// Null forward iterator supported since VS 2015
	static_assert(_MSC_VER >= 1900, "Visual Studio 2015 or higher required, see comment.");
#else
	static_assert(__cplusplus >= 201402L, "C++14 or higher required, see comment.");
#endif

	const PropertyMap& property_map = inline_properties.GetProperties();
	auto it_style_begin = property_map.begin();
	auto it_style_end = property_map.end();

	PropertyMap::const_iterator it_definition{}, it_definition_end{};
	if (definition)
	{
		const PropertyMap& definition_properties = definition->GetProperties().GetProperties();
		it_definition = definition_properties.begin();
		it_definition_end = definition_properties.end();
	}
	return PropertiesIterator(it_style_begin, it_style_end, it_definition, it_definition_end);
}